

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O0

uint Dar_TruthPolarize(uint uTruth,int Polarity,int nVars)

{
  byte bVar1;
  int local_2c;
  int v;
  int Shift;
  int nMints;
  uint uCof1;
  uint uCof0;
  uint uTruthRes;
  int nVars_local;
  int Polarity_local;
  uint uTruth_local;
  
  if (nVars < 6) {
    nVars_local = uTruth;
    for (local_2c = 0; local_2c < nVars; local_2c = local_2c + 1) {
      if ((Polarity & 1 << ((byte)local_2c & 0x1f)) != 0) {
        bVar1 = (byte)(1 << ((byte)local_2c & 0x1f));
        nVars_local = (nVars_local & (Dar_TruthPolarize::Signs[local_2c] ^ 0xffffffff)) <<
                      (bVar1 & 0x1f) |
                      (nVars_local & Dar_TruthPolarize::Signs[local_2c]) >> (bVar1 & 0x1f);
      }
    }
    return nVars_local;
  }
  __assert_fail("nVars < 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                ,0x10a,"unsigned int Dar_TruthPolarize(unsigned int, int, int)");
}

Assistant:

unsigned Dar_TruthPolarize( unsigned uTruth, int Polarity, int nVars )
{
    // elementary truth tables
    static unsigned Signs[5] = {
        0xAAAAAAAA,    // 1010 1010 1010 1010 1010 1010 1010 1010
        0xCCCCCCCC,    // 1010 1010 1010 1010 1010 1010 1010 1010
        0xF0F0F0F0,    // 1111 0000 1111 0000 1111 0000 1111 0000
        0xFF00FF00,    // 1111 1111 0000 0000 1111 1111 0000 0000
        0xFFFF0000     // 1111 1111 1111 1111 0000 0000 0000 0000
    };
    unsigned uTruthRes, uCof0, uCof1;
    int nMints, Shift, v;
    assert( nVars < 6 );
    nMints = (1 << nVars);
    uTruthRes = uTruth;
    for ( v = 0; v < nVars; v++ )
        if ( Polarity & (1 << v) )
        {
            uCof0  = uTruth & ~Signs[v];
            uCof1  = uTruth &  Signs[v];
            Shift  = (1 << v);
            uCof0 <<= Shift;
            uCof1 >>= Shift;
            uTruth = uCof0 | uCof1;
        }
    return uTruth;
}